

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

int32 __thiscall nuraft::raft_server::get_dc_id(raft_server *this,int32 srv_id)

{
  int32 iVar1;
  ptr<srv_config> s_conf;
  ptr<cluster_config> c_conf;
  undefined1 local_30 [24];
  _Alloc_hider local_18;
  
  get_config((raft_server *)(local_30 + 0x10));
  cluster_config::get_server((cluster_config *)local_30,local_30._16_4_);
  if (local_30._0_8_ == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = *(int32 *)(local_30._0_8_ + 4);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._M_p);
  }
  return iVar1;
}

Assistant:

int32 raft_server::get_dc_id(int32 srv_id) const {
    ptr<cluster_config> c_conf = get_config();
    ptr<srv_config> s_conf = c_conf->get_server(srv_id);
    if (!s_conf) return -1; // Not found.

    return s_conf->get_dc_id();
}